

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::StreamExpressionSyntax::setChild
          (StreamExpressionSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  StreamExpressionWithRangeSyntax *pSVar2;
  
  pSVar1 = TokenOrSyntax::node(&child);
  if (index == 0) {
    if (pSVar1 == (SyntaxNode *)0x0) {
      pSVar1 = (SyntaxNode *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node(&child);
    }
    (this->expression).ptr = (ExpressionSyntax *)pSVar1;
  }
  else {
    if (pSVar1 == (SyntaxNode *)0x0) {
      pSVar2 = (StreamExpressionWithRangeSyntax *)0x0;
    }
    else {
      pSVar2 = (StreamExpressionWithRangeSyntax *)TokenOrSyntax::node(&child);
    }
    this->withRange = pSVar2;
  }
  return;
}

Assistant:

void StreamExpressionSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: expression = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 1: withRange = child.node() ? &child.node()->as<StreamExpressionWithRangeSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}